

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

void __thiscall t_st_generator::~t_st_generator(t_st_generator *this)

{
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_st_generator_00411d38;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x98);
  t_generator::~t_generator((t_generator *)this);
  operator_delete(this);
  return;
}

Assistant:

t_st_generator(t_program* program,
                 const std::map<std::string, std::string>& parsed_options,
                 const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    temporary_var = 0;
    std::map<std::string, std::string>::const_iterator iter;

    /* no options yet */
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      throw "unknown option st:" + iter->first;
    }

    out_dir_base_ = "gen-st";
  }